

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_sinh_detail.hpp
# Opt level: O2

void __thiscall
boost::math::quadrature::detail::
tanh_sinh_detail<float,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
::extend_refinements
          (tanh_sinh_detail<float,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
           *this)

{
  uint uVar1;
  pointer pvVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  unsigned_long uVar6;
  pthread_mutex_t *__mutex;
  float fVar7;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  pthread_mutex_t *local_40;
  ulong local_38;
  
  __mutex = (pthread_mutex_t *)&this->m_mutex;
  std::mutex::lock((mutex *)&__mutex->__data);
  if ((ulong)(this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i <
      this->m_max_refinements) {
    LOCK();
    (this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i =
         (this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
    uVar1 = (this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i;
    uVar5 = (ulong)uVar1;
    local_40 = __mutex;
    local_48 = ldexpf(1.0,-uVar1);
    local_44 = local_48 + local_48;
    local_50 = ceilf((this->m_t_max - local_48) / local_44);
    iVar4 = itrunc<float>(&local_50);
    local_38 = uVar5;
    std::vector<float,_std::allocator<float>_>::reserve
              ((this->m_abscissas).
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar5,(long)iVar4);
    std::vector<float,_std::allocator<float>_>::reserve
              ((this->m_weights).
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar5,(long)iVar4);
    uVar6 = 0;
    for (local_50 = local_48; fVar7 = this->m_t_max, local_50 < fVar7;
        local_50 = local_50 + local_44) {
      bVar3 = local_50 < this->m_t_crossover;
      pvVar2 = (this->m_abscissas).
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (this->m_t_crossover <= local_50) {
        local_4c = abscissa_complement_at_t(&local_50);
        local_4c = -local_4c;
      }
      else {
        local_4c = abscissa_at_t(&local_50);
      }
      std::vector<float,_std::allocator<float>_>::emplace_back<float>(pvVar2 + uVar5,&local_4c);
      uVar6 = uVar6 + bVar3;
    }
    (this->m_first_complements).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_start[local_38] = uVar6;
    for (local_50 = local_48; __mutex = local_40, local_50 < fVar7; local_50 = local_50 + local_44)
    {
      pvVar2 = (this->m_weights).
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_4c = weight_at_t(&local_50);
      std::vector<float,_std::allocator<float>_>::emplace_back<float>(pvVar2 + uVar5,&local_4c);
      fVar7 = this->m_t_max;
    }
  }
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void extend_refinements()const
   {
#ifndef BOOST_MATH_NO_ATOMIC_INT
      boost::detail::lightweight_mutex::scoped_lock guard(m_mutex);
#endif
      //
      // Check some other thread hasn't got here after we read the atomic variable, but before we got here:
      //
#ifndef BOOST_MATH_NO_ATOMIC_INT
      if (m_committed_refinements.load() >= m_max_refinements)
         return;
#else
      if (m_committed_refinements >= m_max_refinements)
         return;
#endif

      using std::ldexp;
      using std::ceil;
      ++m_committed_refinements;
#ifndef BOOST_MATH_NO_ATOMIC_INT
      std::size_t row = m_committed_refinements.load();
#else
      std::size_t row = m_committed_refinements;
#endif
      Real h = ldexp(Real(1), -static_cast<int>(row));
      std::size_t first_complement = 0;
      std::size_t n = boost::math::itrunc(ceil((m_t_max - h) / (2 * h)));
      m_abscissas[row].reserve(n);
      m_weights[row].reserve(n);
      for (Real pos = h; pos < m_t_max; pos += 2 * h)
      {
         if (pos < m_t_crossover)
            ++first_complement;
         m_abscissas[row].push_back(pos < m_t_crossover ? abscissa_at_t(pos) : -abscissa_complement_at_t(pos));
      }
      m_first_complements[row] = first_complement;
      for (Real pos = h; pos < m_t_max; pos += 2 * h)
         m_weights[row].push_back(weight_at_t(pos));
   }